

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderNegativeTests.cpp
# Opt level: O2

int __thiscall deqp::ShaderNegativeTests::init(ShaderNegativeTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ShaderUniformInitializeGlobalCase *this_00;
  ShaderConstantSequenceExpressionCase *this_01;
  
  this_00 = (ShaderUniformInitializeGlobalCase *)operator_new(0x80);
  ShaderUniformInitializeGlobalCase::ShaderUniformInitializeGlobalCase
            (this_00,(this->super_TestCaseGroup).m_context,"initialize",
             "Verify initialization of globals with non-constant expressions fails on ES.",
             this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (ShaderConstantSequenceExpressionCase *)operator_new(0x80);
  ShaderConstantSequenceExpressionCase::ShaderConstantSequenceExpressionCase
            (this_01,(this->super_TestCaseGroup).m_context,"constant_sequence",
             "Verify that the sequence operator cannot be used as a constant expression.",
             this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void ShaderNegativeTests::init(void)
{
	addChild(new ShaderUniformInitializeGlobalCase(
		m_context, "initialize", "Verify initialization of globals with non-constant expressions fails on ES.",
		m_glslVersion));
#if 0
	/*
	 * This test is disabled for now since not all existing implementations follow these rules
	 * and enforcing them now would break existing applications, which is unacceptable.
	 *
	 * See https://cvs.khronos.org/bugzilla/show_bug.cgi?id=13922 for further details.
	 */
	addChild(new ShaderUniformPrecisionLinkCase(m_context, "uniform_precision_matching",
			"Verify that linking fails if precision qualifiers on default uniform do not match",
			m_glslVersion));
#endif
	addChild(new ShaderConstantSequenceExpressionCase(
		m_context, "constant_sequence", "Verify that the sequence operator cannot be used as a constant expression.",
		m_glslVersion));
}